

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::getChrmMatrixXYZ
               (float *m,float wX,float wY,float wZ,float rX,float rY,float rZ,float gX,float gY,
               float gZ,float bX,float bY,float bZ)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float local_6c;
  float local_68;
  float local_58;
  float local_48;
  float local_38;
  float local_28;
  float local_18;
  
  local_80 = bX;
  fStack_74 = bY;
  local_6c = gZ;
  local_68 = bZ;
  local_88 = rX;
  local_84 = gX;
  local_7c = rY;
  fStack_78 = gY;
  fStack_70 = rZ;
  local_58 = rY;
  local_48 = gX;
  local_38 = rX;
  local_28 = rZ;
  local_18 = gY;
  uVar4 = invMatrix(&local_88);
  if (uVar4 == 0) {
    fVar1 = local_80 * wZ + local_88 * wX + local_84 * wY;
    fVar3 = wZ * fStack_74 + wX * local_7c + wY * fStack_78;
    fVar2 = wZ * local_68 + wX * fStack_70 + wY * local_6c;
    *m = local_38 * fVar1;
    m[1] = local_48 * fVar3;
    m[2] = bX * fVar2;
    m[3] = local_58 * fVar1;
    m[4] = local_18 * fVar3;
    m[5] = bY * fVar2;
    m[6] = local_28 * fVar1;
    m[7] = gZ * fVar3;
    m[8] = fVar2 * bZ;
  }
  return (uint)(uVar4 != 0);
}

Assistant:

static unsigned getChrmMatrixXYZ(float* m,
                                 float wX, float wY, float wZ,
                                 float rX, float rY, float rZ,
                                 float gX, float gY, float gZ,
                                 float bX, float bY, float bZ) {
  float t[9];
  float rs, gs, bs;
  t[0] = rX; t[1] = gX; t[2] = bX;
  t[3] = rY; t[4] = gY; t[5] = bY;
  t[6] = rZ; t[7] = gZ; t[8] = bZ;
  if(invMatrix(t)) return 1; /* error, not invertible */
  mulMatrix(&rs, &gs, &bs, t, wX, wY, wZ);
  m[0] = rs * rX; m[1] = gs * gX; m[2] = bs * bX;
  m[3] = rs * rY; m[4] = gs * gY; m[5] = bs * bY;
  m[6] = rs * rZ; m[7] = gs * gZ; m[8] = bs * bZ;
  return 0;
}